

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

bool tinyusdz::usda::IsUSDA(string *filename,size_t max_filesize)

{
  bool bVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string err;
  StreamReader sr;
  AsciiParser parser;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  string local_520;
  StreamReader local_500;
  AsciiParser local_4e0;
  
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = false;
  local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_520._M_string_length = 0;
  local_520.field_2._M_local_buf[0] = '\0';
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  bVar1 = io::ReadWholeFile(&local_538,&local_520,filename,max_filesize,(void *)0x0);
  if (bVar1) {
    local_500.length_ =
         (long)local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_500.binary_ =
         local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_500.swap_endian_ = false;
    local_500.idx_ = 0;
    ascii::AsciiParser::AsciiParser(&local_4e0,&local_500);
    bVar2 = ascii::AsciiParser::CheckHeader(&local_4e0);
    ascii::AsciiParser::~AsciiParser(&local_4e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,
                    CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                             local_520.field_2._M_local_buf[0]) + 1);
  }
  if (local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_538.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool IsUSDA(const std::string &filename, size_t max_filesize) {
  // TODO: Read only first N bytes
  std::vector<uint8_t> data;
  std::string err;

  if (!io::ReadWholeFile(&data, &err, filename, max_filesize)) {
    return false;
  }

  tinyusdz::StreamReader sr(data.data(), data.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  return parser.CheckHeader();
}